

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_u_mul(double *res,double *u,double *v,size_t n,size_t m)

{
  double *pdVar1;
  double *pdVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  double dVar8;
  
  pdVar1 = v;
  for (sVar4 = 0; sVar4 != m; sVar4 = sVar4 + 1) {
    lVar6 = 0;
    pdVar2 = pdVar1;
    sVar5 = sVar4;
    for (sVar7 = 0; sVar7 != n; sVar7 = sVar7 + 1) {
      dVar8 = u[lVar6] * v[sVar5];
      res[sVar5] = dVar8;
      for (sVar3 = m; lVar6 = lVar6 + 1, sVar5 + sVar3 < m * n; sVar3 = sVar3 + m) {
        dVar8 = dVar8 + u[lVar6] * pdVar2[sVar3];
        res[sVar5] = dVar8;
      }
      pdVar2 = pdVar2 + m;
      sVar5 = sVar5 + m;
    }
    pdVar1 = pdVar1 + 1;
  }
  return;
}

Assistant:

void fsnav_linal_u_mul(double* res, double* u, double* v, const size_t n, const size_t m)
{
	size_t i, j, k, p, p0, mn;

	mn = m*n;
	for (j = 0; j < m; j++) {
		for (i = 0, k = 0, p0 = j; i < n; i++, p0 += m) {
			res[p0] = u[k]*v[p0];
			for (p = p0+m, k++; p < mn; p += m, k++)
				res[p0] += u[k]*v[p];
		}
	}
}